

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

bool __thiscall Engine::constrain(Engine *this)

{
  IntVar *pIVar1;
  _func_int **pp_Var2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  FlatZincSpace *this_00;
  uint uVar7;
  uint uVar8;
  FlatZincSpace *this_01;
  int local_2c;
  
  this->best_sol = (this->opt_var->min).v;
  lVar6 = std::chrono::_V2::steady_clock::now();
  (this->opt_time).__r = (lVar6 - (this->start_time).__d.__r) / 1000000 - (this->init_time).__r;
  if (so.sbps == true) {
    saveCurrentSolution(this);
  }
  bVar4 = true;
  if (this->problem == (Problem *)0x0) {
    this_01 = (FlatZincSpace *)0x0;
  }
  else {
    this_00 = (FlatZincSpace *)
              __dynamic_cast(this->problem,&Problem::typeinfo,&FlatZinc::FlatZincSpace::typeinfo,0);
    this_01 = (FlatZincSpace *)0x0;
    if (this_00 != (FlatZincSpace *)0x0) {
      FlatZinc::FlatZincSpace::storeSolution(this_00);
      bVar4 = false;
      this_01 = this_00;
    }
  }
  SAT::btToLevel(&sat,0);
  this->restart_count = this->restart_count + 1;
  std::vector<int,_std::allocator<int>_>::resize(&nodepath,0);
  std::vector<int,_std::allocator<int>_>::resize(&altpath,0);
  if ((so.print_nodes != false) || (profilerConnector->_connected == true)) {
    cpprofiler::Connector::restart(profilerConnector,this->restart_count);
  }
  pIVar1 = this->opt_var;
  iVar5 = this->best_sol;
  pp_Var2 = (pIVar1->super_Var).super_Branching._vptr_Branching;
  if (so.lazy == true) {
    uVar8 = (uint)(this->opt_type == 0);
    uVar7 = (-uVar8 | 1) + iVar5;
    iVar5 = (*pp_Var2[0xd])(pIVar1,(long)(int)uVar7,(ulong)(uVar8 | 2),(ulong)uVar7);
    uVar7 = (this->assumptions).sz;
    if (uVar7 == 0) {
      local_2c = iVar5;
      vec<int>::push(&this->assumptions,&local_2c);
    }
    else {
      (this->assumptions).data[uVar7 - 1] = iVar5;
    }
  }
  else {
    if (this->opt_type == 0) {
      iVar5 = (*pp_Var2[0xf])(pIVar1,(long)iVar5 + -1,0,1);
      cVar3 = (char)iVar5;
    }
    else {
      iVar5 = (*pp_Var2[0xe])(pIVar1,(long)iVar5 + 1,0,1);
      cVar3 = (char)iVar5;
    }
    if (cVar3 == '\0') {
      return false;
    }
  }
  if ((!bVar4) && (bVar4 = FlatZinc::FlatZincSpace::onRestart(this_01,this), bVar4)) {
    return false;
  }
  return true;
}

Assistant:

inline bool Engine::constrain() {
	best_sol = opt_var->getVal();
	opt_time = std::chrono::duration_cast<duration>(chuffed_clock::now() - start_time) - init_time;

	// Solution-based phase saving
	if (so.sbps) {
		saveCurrentSolution();
	}
	auto* fzn = dynamic_cast<FlatZinc::FlatZincSpace*>(problem);
	if (fzn != nullptr) {
		fzn->storeSolution();
	}

	sat.btToLevel(0);
	restart_count++;
	nodepath.resize(0);
	altpath.resize(0);
	/* nextnodeid = 0; */
#ifdef HAS_PROFILER
	if (doProfiling()) {
		profilerConnector->restart(restart_count);
	}
#endif

	//  printf("opt_var = %d, opt_type = %d, best_sol = %d\n", opt_var->var_id, opt_type, best_sol);
	//  printf("%% opt_var min = %d, opt_var max = %d\n", opt_var->getMin(), opt_var->getMax());

	if (so.lazy) {
		const Lit p =
				opt_type != 0 ? opt_var->getLit(best_sol + 1, LR_GE) : opt_var->getLit(best_sol - 1, LR_LE);
		// GKG: Preserves existing assumptions, but assumes we've reserved
		// space at the end for the objective bound.
		if (assumptions.size() == 0) {
			assumptions.push(toInt(p));
		} else {
			assumptions.last() = toInt(p);
		}
	} else {
		// Special-case, since get-lit breaks if lazy is false.
		if (opt_type != 0) {  // maximize
			if (!opt_var->setMin(best_sol + 1)) {
				return false;
			}
		} else {
			if (!opt_var->setMax(best_sol - 1)) {
				return false;
			}
		}
	}

	if (fzn != nullptr) {
		const bool done = fzn->onRestart(this);
		if (done) {
			return false;
		}
	}

	if (so.mip) {
		mip->setObjective(best_sol);
	}

	/* return (opt_type ? opt_var->setMin(best_sol+1) : opt_var->setMax(best_sol-1)); */
	return true;
}